

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

uint8_t rev_byte(uint8_t sprite_byte)

{
  byte abStack_48 [32];
  int local_28;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  int bits_left;
  uint8_t shift_amount;
  uint8_t bit_num;
  uint8_t mask;
  uint8_t reversed;
  unsigned_long __vla_expr0;
  uint8_t bit_count;
  uint8_t sprite_byte_local;
  
  local_21 = 0;
  local_22 = 1;
  for (local_23 = 0; local_23 < 8; local_23 = local_23 + 1) {
    abStack_48[local_23] = (sprite_byte & local_22) != 0;
    local_22 = local_22 << 1;
  }
  local_24 = 0;
  for (local_28 = 7; -1 < local_28; local_28 = local_28 + -1) {
    local_21 = local_21 | (abStack_48[local_28] & 1) << (local_24 & 0x1f);
    local_24 = local_24 + 1;
  }
  return local_21;
}

Assistant:

static uint8_t rev_byte(uint8_t sprite_byte) {
    uint8_t bit_count = 8;
    bool bits[bit_count];
    uint8_t reversed = 0;

    uint8_t mask = 0x1;
    for(uint8_t bit_num = 0; bit_num < bit_count; bit_num++) {
        bits[bit_num] = sprite_byte & mask;
        mask <<= 1;
    }

    uint8_t shift_amount = 0;
    for(int bits_left = 7; bits_left >= 0; bits_left--) {
        reversed |= bits[bits_left] << shift_amount;
        shift_amount++;
    }
    return reversed;
}